

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::GeoParquetFileMetadata::CreateColumnReader
          (GeoParquetFileMetadata *this,ParquetReader *reader,ParquetColumnSchema *schema,
          ClientContext *context)

{
  undefined1 auVar1 [8];
  undefined1 auVar2 [8];
  mapped_type *pmVar3;
  Catalog *this_00;
  const_reference pvVar4;
  ScalarFunctionCatalogEntry *pSVar5;
  NotImplementedException *this_01;
  pointer *__ptr;
  ClientContext *in_R8;
  vector<duckdb::ParquetColumnSchema,_true> *this_02;
  initializer_list<duckdb::LogicalType> __l;
  undefined1 local_1a8 [8];
  LogicalType local_1a0;
  string local_188;
  int local_160;
  undefined4 uStack_15c;
  ScalarFunction conversion_func;
  
  pmVar3 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(reader->super_BaseFileReader).column_ids.column_ids.
                            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            .
                            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (key_type *)
                        &(context->super_enable_shared_from_this<duckdb::ClientContext>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  this_00 = Catalog::GetSystemCatalog(in_R8);
  this_02 = (vector<duckdb::ParquetColumnSchema,_true> *)
            ((long)&(context->config).profiler_save_location.field_2 + 8);
  pvVar4 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(this_02,0);
  if (((pvVar4->type).id_ == BLOB) && (pmVar3->geometry_encoding == WKB)) {
    ::std::__cxx11::string::string((string *)&conversion_func,"main",(allocator *)(local_1a8 + 8));
    ::std::__cxx11::string::string((string *)&local_188,"st_geomfromwkb",(allocator *)local_1a8);
    pSVar5 = Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                       (this_00,in_R8,(string *)&conversion_func,&local_188,
                        (QueryErrorContext)0xffffffffffffffff);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::__cxx11::string::~string((string *)&conversion_func);
    LogicalType::LogicalType((LogicalType *)(local_1a8 + 8),BLOB);
    __l._M_len = 1;
    __l._M_array = (iterator)(local_1a8 + 8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188,__l,
               (allocator_type *)local_1a8);
    ScalarFunctionSet::GetFunctionByArguments
              (&conversion_func,&pSVar5->functions,in_R8,
               (vector<duckdb::LogicalType,_true> *)&local_188);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188);
    LogicalType::~LogicalType((LogicalType *)(local_1a8 + 8));
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = 0;
    local_188.field_2._M_allocated_capacity = 0;
    local_160 = 0;
    make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalTypeId_const&,int>
              ((duckdb *)local_1a8,&LogicalType::BLOB,&local_160);
    auVar1 = local_1a8;
    local_1a8 = (undefined1  [8])0x0;
    auVar2 = local_1a8;
    local_1a8[0] = auVar1[0];
    local_1a8[1] = auVar1[1];
    local_1a8._2_6_ = auVar1._2_6_;
    local_1a0.id_ = local_1a8[0];
    local_1a0.physical_type_ = local_1a8[1];
    local_1a0._2_6_ = local_1a8._2_6_;
    local_1a8 = auVar2;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_188,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_1a8 + 8));
    if ((_Head_base<0UL,_duckdb::ColumnReader_*,_false>)local_1a0._0_8_ !=
        (_Head_base<0UL,_duckdb::ColumnReader_*,_false>)0x0) {
      (*(*(_func_int ***)local_1a0._0_8_)[1])();
    }
    local_1a0._0_8_ = (ParquetColumnSchema *)0x0;
    if ((_Head_base<0UL,_duckdb::ColumnReader_*,_false>)local_1a8 !=
        (_Head_base<0UL,_duckdb::ColumnReader_*,_false>)0x0) {
      (*(*(_func_int ***)local_1a8)[1])();
    }
    local_1a8 = (undefined1  [8])0x0;
    make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
              ((LogicalType *)(local_1a8 + 8),
               (ScalarFunction *)&conversion_func.super_BaseScalarFunction.return_type,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&conversion_func,(void **)&local_188);
    pvVar4 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(this_02,0);
    ColumnReader::CreateReader((ColumnReader *)local_1a8,(ParquetReader *)schema,pvVar4);
    make_uniq<duckdb::ExpressionColumnReader,duckdb::ClientContext&,duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>,duckdb::unique_ptr<duckdb::BoundFunctionExpression,std::default_delete<duckdb::BoundFunctionExpression>,true>>
              ((duckdb *)&local_160,in_R8,
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               local_1a8,
               (unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                *)(local_1a8 + 8));
    (this->write_lock).super___mutex_base._M_mutex.__align = CONCAT44(uStack_15c,local_160);
    if (local_1a8 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_1a8)[1])();
    }
    if ((ParquetColumnSchema *)local_1a0._0_8_ != (ParquetColumnSchema *)0x0) {
      (**(code **)(*(long *)(ParquetColumnSchemaType *)local_1a0._0_8_ + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_188);
    ScalarFunction::~ScalarFunction(&conversion_func);
    return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
           (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&conversion_func,"Unsupported geometry encoding",(allocator *)&local_188);
  NotImplementedException::NotImplementedException(this_01,(string *)&conversion_func);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnReader> GeoParquetFileMetadata::CreateColumnReader(ParquetReader &reader,
                                                                    const ParquetColumnSchema &schema,
                                                                    ClientContext &context) {

	D_ASSERT(IsGeometryColumn(schema.name));

	const auto &column = geometry_columns[schema.name];

	// Get the catalog
	auto &catalog = Catalog::GetSystemCatalog(context);

	// WKB encoding
	if (schema.children[0].type.id() == LogicalTypeId::BLOB &&
	    column.geometry_encoding == GeoParquetColumnEncoding::WKB) {
		// Look for a conversion function in the catalog
		auto &conversion_func_set =
		    catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, "st_geomfromwkb");
		auto conversion_func = conversion_func_set.functions.GetFunctionByArguments(context, {LogicalType::BLOB});

		// Create a bound function call expression
		auto args = vector<unique_ptr<Expression>>();
		args.push_back(std::move(make_uniq<BoundReferenceExpression>(LogicalType::BLOB, 0)));
		auto expr =
		    make_uniq<BoundFunctionExpression>(conversion_func.return_type, conversion_func, std::move(args), nullptr);

		// Create a child reader
		auto child_reader = ColumnReader::CreateReader(reader, schema.children[0]);

		// Create an expression reader that applies the conversion function to the child reader
		return make_uniq<ExpressionColumnReader>(context, std::move(child_reader), std::move(expr));
	}

	// Otherwise, unrecognized encoding
	throw NotImplementedException("Unsupported geometry encoding");
}